

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O3

QList<QPrint::ColorMode> * __thiscall
QPlatformPrintDevice::supportedColorModes
          (QList<QPrint::ColorMode> *__return_storage_ptr__,QPlatformPrintDevice *this)

{
  Data *pDVar1;
  
  if (this->m_haveColorModes == false) {
    (*this->_vptr_QPlatformPrintDevice[0x2b])(this);
  }
  pDVar1 = (this->m_colorModes).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (this->m_colorModes).d.ptr;
  (__return_storage_ptr__->d).size = (this->m_colorModes).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QPrint::ColorMode> QPlatformPrintDevice::supportedColorModes() const
{
    if (!m_haveColorModes)
        loadColorModes();
    return m_colorModes;
}